

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall
Assimp::MD5Importer::InternReadFile
          (MD5Importer *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  aiNode *paVar1;
  bool bVar2;
  long lVar3;
  DeadlyImportError *pDVar4;
  allocator local_61;
  string extension;
  string local_40;
  
  this->pIOHandler = _pIOHandler;
  this->pScene = _pScene;
  this->bHadMD5Camera = false;
  this->bHadMD5Mesh = false;
  this->bHadMD5Anim = false;
  lVar3 = std::__cxx11::string::rfind((char)pFile,0x2e);
  if (lVar3 == -1) {
    std::__cxx11::string::string((string *)&extension,(string *)pFile);
  }
  else {
    std::__cxx11::string::substr((ulong)&extension,(ulong)pFile);
  }
  std::__cxx11::string::_M_assign((string *)&this->mFile);
  std::__cxx11::string::~string((string *)&extension);
  BaseImporter::GetExtension(&extension,pFile);
  bVar2 = std::operator==(&extension,"md5camera");
  if (bVar2) {
    LoadMD5CameraFile(this);
    goto LAB_00419c03;
  }
  if (this->configNoAutoLoad == false) {
    bVar2 = std::operator==(&extension,"md5anim");
    if (bVar2) goto LAB_00419bb3;
    LoadMD5MeshFile(this);
  }
  else {
LAB_00419bb3:
    if (extension._M_string_length == 0) {
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_40,"Failure, need file extension to determine MD5 part type",
                 &local_61);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_40);
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar2 = std::operator==(&extension,"md5anim");
    if (!bVar2) {
      bVar2 = std::operator==(&extension,"md5mesh");
      if (bVar2) {
        LoadMD5MeshFile(this);
      }
      goto LAB_00419c03;
    }
  }
  LoadMD5AnimFile(this);
LAB_00419c03:
  if (((this->bHadMD5Mesh == false) && (this->bHadMD5Anim == false)) &&
     (this->bHadMD5Camera == false)) {
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_40,"Failed to read valid contents out of this MD5* file",&local_61);
    DeadlyImportError::DeadlyImportError(pDVar4,&local_40);
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar1 = this->pScene->mRootNode;
  (paVar1->mTransformation).a1 = 1.0;
  (paVar1->mTransformation).b2 = 0.0;
  (paVar1->mTransformation).a2 = 0.0;
  (paVar1->mTransformation).a3 = 0.0;
  (paVar1->mTransformation).a4 = 0.0;
  (paVar1->mTransformation).b1 = 0.0;
  (paVar1->mTransformation).b3 = 1.0;
  (paVar1->mTransformation).b4 = 0.0;
  (paVar1->mTransformation).c1 = 0.0;
  (paVar1->mTransformation).c2 = -1.0;
  (paVar1->mTransformation).c3 = 0.0;
  (paVar1->mTransformation).c4 = 0.0;
  (paVar1->mTransformation).d1 = 0.0;
  (paVar1->mTransformation).d2 = 0.0;
  (paVar1->mTransformation).d3 = 0.0;
  (paVar1->mTransformation).d4 = 1.0;
  if (this->bHadMD5Mesh == false) {
    this->pScene->mFlags = this->pScene->mFlags | 1;
  }
  UnloadFileFromMemory(this);
  std::__cxx11::string::~string((string *)&extension);
  return;
}

Assistant:

void MD5Importer::InternReadFile( const std::string& pFile,
                                 aiScene* _pScene, IOSystem* _pIOHandler)
{
    pIOHandler = _pIOHandler;
    pScene     = _pScene;
    bHadMD5Mesh = bHadMD5Anim = bHadMD5Camera = false;

    // remove the file extension
    const std::string::size_type pos = pFile.find_last_of('.');
    mFile = (std::string::npos == pos ? pFile : pFile.substr(0,pos+1));

    const std::string extension = GetExtension(pFile);
    try {
        if (extension == "md5camera") {
            LoadMD5CameraFile();
        }
        else if (configNoAutoLoad || extension == "md5anim") {
            // determine file extension and process just *one* file
            if (extension.length() == 0) {
                throw DeadlyImportError("Failure, need file extension to determine MD5 part type");
            }
            if (extension == "md5anim") {
                LoadMD5AnimFile();
            }
            else if (extension == "md5mesh") {
                LoadMD5MeshFile();
            }
        }
        else {
            LoadMD5MeshFile();
            LoadMD5AnimFile();
        }
    }
    catch ( ... ) { // std::exception, Assimp::DeadlyImportError
        UnloadFileFromMemory();
        throw;
    }

    // make sure we have at least one file
    if (!bHadMD5Mesh && !bHadMD5Anim && !bHadMD5Camera) {
        throw DeadlyImportError("Failed to read valid contents out of this MD5* file");
    }

    // Now rotate the whole scene 90 degrees around the x axis to match our internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

    // the output scene wouldn't pass the validation without this flag
    if (!bHadMD5Mesh) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    // clean the instance -- the BaseImporter instance may be reused later.
    UnloadFileFromMemory();
}